

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlNodePtr xmlAddChildList(xmlNodePtr parent,xmlNodePtr cur)

{
  xmlNodePtr text;
  _xmlNode *p_Var1;
  int iVar2;
  xmlNodePtr pxVar3;
  _xmlNode *p_Var4;
  bool bVar5;
  
  if (parent == (xmlNodePtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  if (cur == (xmlNodePtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  if (parent->type == XML_NAMESPACE_DECL) {
    return (xmlNodePtr)0x0;
  }
  if (cur->type == XML_NAMESPACE_DECL) {
LAB_0014bdd5:
    cur = (xmlNodePtr)0x0;
  }
  else {
    if (cur != (xmlNodePtr)0x0) {
      bVar5 = false;
      p_Var4 = cur;
      do {
        if ((p_Var4->doc != parent->doc) && (iVar2 = xmlSetTreeDoc(p_Var4,parent->doc), iVar2 < 0))
        {
          bVar5 = true;
        }
        p_Var4 = p_Var4->next;
      } while (p_Var4 != (_xmlNode *)0x0);
      if (bVar5) goto LAB_0014bdd5;
    }
    if (parent->children == (_xmlNode *)0x0) {
      parent->children = cur;
    }
    else {
      text = parent->last;
      if (((cur->type == XML_TEXT_NODE) && (text->type == XML_TEXT_NODE)) &&
         (cur->name == text->name)) {
        iVar2 = xmlTextAddContent(text,cur->content,-1);
        if (iVar2 < 0) {
          bVar5 = false;
          pxVar3 = (xmlNodePtr)0x0;
        }
        else {
          p_Var4 = cur->next;
          xmlFreeNode(cur);
          bVar5 = p_Var4 != (_xmlNode *)0x0;
          pxVar3 = text;
          if (bVar5) {
            cur = p_Var4;
          }
        }
        if (!bVar5) {
          return pxVar3;
        }
      }
      text->next = cur;
      cur->prev = text;
    }
    p_Var4 = cur->next;
    while (p_Var1 = p_Var4, p_Var1 != (_xmlNode *)0x0) {
      cur->parent = parent;
      cur = p_Var1;
      p_Var4 = p_Var1->next;
    }
    cur->parent = parent;
    parent->last = cur;
  }
  return cur;
}

Assistant:

xmlNodePtr
xmlAddChildList(xmlNodePtr parent, xmlNodePtr cur) {
    xmlNodePtr iter;
    xmlNodePtr prev;
    int oom;

    if ((parent == NULL) || (parent->type == XML_NAMESPACE_DECL)) {
	return(NULL);
    }

    if ((cur == NULL) || (cur->type == XML_NAMESPACE_DECL)) {
	return(NULL);
    }

    oom = 0;
    for (iter = cur; iter != NULL; iter = iter->next) {
	if (iter->doc != parent->doc) {
	    if (xmlSetTreeDoc(iter, parent->doc) < 0)
                oom = 1;
	}
    }
    if (oom)
        return(NULL);

    /*
     * add the first element at the end of the children list.
     */

    if (parent->children == NULL) {
        parent->children = cur;
    } else {
        prev = parent->last;

	/*
	 * If cur and parent->last both are TEXT nodes, then merge them.
	 */
	if ((cur->type == XML_TEXT_NODE) &&
	    (prev->type == XML_TEXT_NODE) &&
	    (cur->name == prev->name)) {
            xmlNodePtr next;

            if (xmlTextAddContent(prev, cur->content, -1) < 0)
                return(NULL);
            next = cur->next;
	    xmlFreeNode(cur);
	    /*
	     * if it's the only child, nothing more to be done.
	     */
	    if (next == NULL)
		return(prev);
	    cur = next;
	}

	prev->next = cur;
	cur->prev = prev;
    }
    while (cur->next != NULL) {
	cur->parent = parent;
        cur = cur->next;
    }
    cur->parent = parent;
    parent->last = cur;

    return(cur);
}